

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.hpp
# Opt level: O2

bool __thiscall parser::state::set_memo(state *this,posn *p,ind id,memo *m)

{
  ulong uVar1;
  ulong uVar2;
  size_type sVar3;
  _Map_base<unsigned_long,_std::pair<const_unsigned_long,_parser::memo>,_std::allocator<std::pair<const_unsigned_long,_parser::memo>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
  *this_00;
  mapped_type *this_01;
  ind local_38;
  
  uVar1 = p->i;
  uVar2 = (this->off).i;
  if (uVar2 <= uVar1) {
    local_38 = id;
    for (sVar3 = std::
                 deque<std::unordered_map<unsigned_long,_parser::memo,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_parser::memo>_>_>,_std::allocator<std::unordered_map<unsigned_long,_parser::memo,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_parser::memo>_>_>_>_>
                 ::size(&this->memo_table); sVar3 <= uVar1 - uVar2; sVar3 = sVar3 + 1) {
      std::
      deque<std::unordered_map<unsigned_long,_parser::memo,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_parser::memo>_>_>,_std::allocator<std::unordered_map<unsigned_long,_parser::memo,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_parser::memo>_>_>_>_>
      ::emplace_back<>(&this->memo_table);
    }
    this_00 = (_Map_base<unsigned_long,_std::pair<const_unsigned_long,_parser::memo>,_std::allocator<std::pair<const_unsigned_long,_parser::memo>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
               *)std::
                 _Deque_iterator<std::unordered_map<unsigned_long,_parser::memo,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_parser::memo>_>_>,_std::unordered_map<unsigned_long,_parser::memo,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_parser::memo>_>_>_&,_std::unordered_map<unsigned_long,_parser::memo,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_parser::memo>_>_>_*>
                 ::operator[](&(this->memo_table).
                               super__Deque_base<std::unordered_map<unsigned_long,_parser::memo,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_parser::memo>_>_>,_std::allocator<std::unordered_map<unsigned_long,_parser::memo,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_parser::memo>_>_>_>_>
                               ._M_impl.super__Deque_impl_data._M_start,uVar1 - uVar2);
    this_01 = std::__detail::
              _Map_base<unsigned_long,_std::pair<const_unsigned_long,_parser::memo>,_std::allocator<std::pair<const_unsigned_long,_parser::memo>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
              ::operator[](this_00,&local_38);
    parser::memo::operator=(this_01,m);
  }
  return uVar2 <= uVar1;
}

Assistant:

bool set_memo(const struct posn& p, ind id, const struct memo& m) {
			// ignore forgotten position
			if ( p < off ) return false;
			
			// ensure table initialized
			ind i = p.i - off.i;
			for (ind ii = memo_table.size(); ii <= i; ++ii) memo_table.emplace_back();
			
			// set table entry
			memo_table[i][id] = m;
			return true;
		}